

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

void rescale(Mat *colorfulImage,Mat *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int in_R8D;
  int local_70;
  uint local_6c;
  _InputArray local_68;
  undefined4 local_50 [2];
  Mat *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = 0;
  local_50[0] = 0x1010000;
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  local_68.flags = 0x2010000;
  local_68.obj = image;
  local_48 = colorfulImage;
  cv::cvtColor((cv *)local_50,&local_68,(_OutputArray *)0x6,0,in_R8D);
  local_6c = image->rows;
  while (600 < (int)local_6c) {
    local_40 = 0;
    local_50[0] = 0x1010000;
    local_68.sz.width = 0;
    local_68.sz.height = 0;
    local_68.flags = 0x2010000;
    local_70 = image->cols / 2;
    local_6c = local_6c >> 1;
    local_68.obj = image;
    local_48 = image;
    cv::resize(local_50,&local_68,&local_70,1);
    local_40 = 0;
    local_50[0] = 0x1010000;
    local_68.sz.width = 0;
    local_68.sz.height = 0;
    local_68.flags = 0x2010000;
    uVar1 = colorfulImage->rows;
    uVar2 = colorfulImage->cols;
    local_38 = CONCAT44((int)uVar1 / 2,(int)uVar2 / 2);
    local_68.obj = colorfulImage;
    local_48 = colorfulImage;
    cv::resize(0,0,local_50,&local_68,&local_38,1);
    local_6c = image->rows;
  }
  return;
}

Assistant:

void rescale(Mat& colorfulImage, Mat& image){
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    // Shrink the image size
    while(image.rows > 600){
        resize(image, image, Size(image.cols/2,image.rows/2)); 
        resize(colorfulImage, colorfulImage, Size(colorfulImage.cols/2,colorfulImage.rows/2));
    }
}